

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::ExpandWithData
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data,
          ExpandEmitter *expand_emitter)

{
  bool bVar1;
  RefcountedTemplate *this_00;
  Mutex *this_01;
  TemplateCacheKey template_cache_key;
  TemplateCacheKey local_40;
  
  local_40.first = TemplateString::GetGlobalId(filename);
  this_01 = this->mutex_;
  local_40.second = strip;
  Mutex::Lock(this_01);
  this_00 = GetTemplateLocked(this,filename,strip,&local_40);
  if (this_00 == (RefcountedTemplate *)0x0) {
    bVar1 = false;
  }
  else {
    RefcountedTemplate::IncRef(this_00);
    Mutex::Unlock(this_01);
    bVar1 = Template::ExpandWithDataAndCache(this_00->ptr_,expand_emitter,dict,per_expand_data,this)
    ;
    this_01 = this->mutex_;
    Mutex::Lock(this_01);
    RefcountedTemplate::DecRef(this_00);
  }
  Mutex::Unlock(this_01);
  return bVar1;
}

Assistant:

bool TemplateCache::ExpandWithData(const TemplateString& filename,
                                   Strip strip,
                                   const TemplateDictionaryInterface *dict,
                                   PerExpandData *per_expand_data,
                                   ExpandEmitter *expand_emitter) {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  // We make a local copy of this struct so we don't have to worry about
  // what happens to our cache while we don't hold the lock (during Expand).
  RefcountedTemplate* refcounted_tpl = NULL;
  {
    WriterMutexLock ml(mutex_);
    // Optionally load the template (depending on whether the cache is frozen,
    // the reload bit is set etc.)
    refcounted_tpl = GetTemplateLocked(filename, strip, template_cache_key);
    if (!refcounted_tpl)
      return false;
    refcounted_tpl->IncRef();
  }
  const bool result = refcounted_tpl->tpl()->ExpandWithDataAndCache(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    refcounted_tpl->DecRef();
  }
  return result;
}